

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool op_strex(DisasContext_conflict1 *s,arg_STREX *a,MemOp mop,_Bool rel)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 var;
  bool bVar2;
  _Bool v8a;
  TCGv_i32 addr;
  TCGContext_conflict1 *tcg_ctx;
  _Bool rel_local;
  MemOp mop_local;
  arg_STREX *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = arm_dc_feature(s,0x1b);
  bVar2 = false;
  if (iVar1 != 0) {
    iVar1 = arm_dc_feature(s,9);
    bVar2 = iVar1 == 0;
  }
  if ((((((a->rd == 0xf) || (a->rn == 0xf)) || (a->rt == 0xf)) ||
       ((a->rd == a->rn || (a->rd == a->rt)))) ||
      (((!bVar2 && (s->thumb != 0)) && ((a->rd == 0xd || (a->rt == 0xd)))))) ||
     ((mop == MO_64 &&
      (((a->rt2 == 0xf || (a->rd == a->rt2)) || ((!bVar2 && ((s->thumb != 0 && (a->rt2 == 0xd)))))))
      ))) {
    unallocated_encoding_aarch64(s);
  }
  else {
    if (rel) {
      tcg_gen_mb_aarch64(tcg_ctx_00,TCG_BAR_STRL|TCG_MO_ALL);
    }
    var = tcg_temp_local_new_i32(tcg_ctx_00);
    load_reg_var(s,var,a->rn);
    tcg_gen_addi_i32_aarch64(tcg_ctx_00,var,var,a->imm);
    gen_store_exclusive(s,a->rd,a->rt,a->rt2,var,mop);
    tcg_temp_free_i32(tcg_ctx_00,var);
  }
  return true;
}

Assistant:

static bool op_strex(DisasContext *s, arg_STREX *a, MemOp mop, bool rel)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 addr;
    /* Some cases stopped being UNPREDICTABLE in v8A (but not v8M) */
    bool v8a = ENABLE_ARCH_8 && !arm_dc_feature(s, ARM_FEATURE_M);

    /* We UNDEF for these UNPREDICTABLE cases.  */
    if (a->rd == 15 || a->rn == 15 || a->rt == 15
        || a->rd == a->rn || a->rd == a->rt
        || (!v8a && s->thumb && (a->rd == 13 || a->rt == 13))
        || (mop == MO_64
            && (a->rt2 == 15
                || a->rd == a->rt2
                || (!v8a && s->thumb && a->rt2 == 13)))) {
        unallocated_encoding(s);
        return true;
    }

    if (rel) {
        tcg_gen_mb(tcg_ctx, TCG_MO_ALL | TCG_BAR_STRL);
    }

    addr = tcg_temp_local_new_i32(tcg_ctx);
    load_reg_var(s, addr, a->rn);
    tcg_gen_addi_i32(tcg_ctx, addr, addr, a->imm);

    gen_store_exclusive(s, a->rd, a->rt, a->rt2, addr, mop);
    tcg_temp_free_i32(tcg_ctx, addr);
    return true;
}